

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

Curl_easy * Curl_multi_get_handle(Curl_multi *multi,curl_off_t mid)

{
  Curl_llist_node *pCVar1;
  Curl_easy *pCVar2;
  
  if (mid < 0) {
    return (Curl_easy *)0x0;
  }
  for (pCVar1 = Curl_llist_head(&multi->process); pCVar1 != (Curl_llist_node *)0x0;
      pCVar1 = Curl_node_next(pCVar1)) {
    pCVar2 = (Curl_easy *)Curl_node_elem(pCVar1);
    if (pCVar2->mid == mid) {
      return pCVar2;
    }
  }
  for (pCVar1 = Curl_llist_head(&multi->msgsent); pCVar1 != (Curl_llist_node *)0x0;
      pCVar1 = Curl_node_next(pCVar1)) {
    pCVar2 = (Curl_easy *)Curl_node_elem(pCVar1);
    if (pCVar2->mid == mid) {
      return pCVar2;
    }
  }
  pCVar1 = Curl_llist_head(&multi->pending);
  while( true ) {
    if (pCVar1 == (Curl_llist_node *)0x0) {
      return (Curl_easy *)0x0;
    }
    pCVar2 = (Curl_easy *)Curl_node_elem(pCVar1);
    if (pCVar2->mid == mid) break;
    pCVar1 = Curl_node_next(pCVar1);
  }
  return pCVar2;
}

Assistant:

struct Curl_easy *Curl_multi_get_handle(struct Curl_multi *multi,
                                        curl_off_t mid)
{

  if(mid >= 0) {
    struct Curl_easy *data;
    struct Curl_llist_node *e;

    for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
      data = Curl_node_elem(e);
      if(data->mid == mid)
        return data;
    }
    /* may be in msgsent queue */
    for(e = Curl_llist_head(&multi->msgsent); e; e = Curl_node_next(e)) {
      data = Curl_node_elem(e);
      if(data->mid == mid)
        return data;
    }
    /* may be in pending queue */
    for(e = Curl_llist_head(&multi->pending); e; e = Curl_node_next(e)) {
      data = Curl_node_elem(e);
      if(data->mid == mid)
        return data;
    }
  }
  return NULL;
}